

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void * TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstruct<double>_>::ThreadWork(void *voidptr)

{
  undefined1 uVar1;
  TPZFMatrix<double> *assembleItem;
  void *in_RDI;
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstruct<double>_> data;
  TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstruct<double>_> *myptr;
  TPZFMatrix<double> *in_stack_00000440;
  TPZFMatrix<double> *in_stack_00000448;
  TPZDohrSubstruct<double> *in_stack_00000450;
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstruct<double>_> *in_stack_ffffffffffffff78;
  TPZDohrAssembleList<double> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffffa0;
  TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstruct<double>_> *in_stack_ffffffffffffffb8;
  TPZAutoPointer<TPZDohrSubstruct<double>_> local_28;
  TPZAutoPointer local_20 [8];
  TPZAutoPointer<TPZDohrAssembleItem<double>_> local_18;
  void *local_10;
  void *local_8;
  
  local_10 = in_RDI;
  local_8 = in_RDI;
  PopItem(in_stack_ffffffffffffffb8);
  while( true ) {
    uVar1 = TPZDohrPrecondV2SubData<double,_TPZDohrSubstruct<double>_>::IsValid
                      ((TPZDohrPrecondV2SubData<double,_TPZDohrSubstruct<double>_> *)0x1f77e05);
    if (!(bool)uVar1) break;
    TPZAutoPointer<TPZDohrSubstruct<double>_>::operator->(&local_28);
    assembleItem = ::TPZAutoPointer::operator_cast_to_TPZFMatrix_(local_20);
    TPZAutoPointer<TPZDohrAssembleItem<double>_>::operator->(&local_18);
    TPZDohrSubstruct<double>::Contribute_v2_local
              (in_stack_00000450,in_stack_00000448,in_stack_00000440);
    in_stack_ffffffffffffff80 =
         TPZAutoPointer<TPZDohrAssembleList<double>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembleList<double>_> *)((long)local_10 + 0x40));
    TPZAutoPointer<TPZDohrAssembleItem<double>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleItem<double>_> *)in_stack_ffffffffffffff80,
               (TPZAutoPointer<TPZDohrAssembleItem<double>_> *)in_stack_ffffffffffffff78);
    TPZDohrAssembleList<double>::AddItem
              ((TPZDohrAssembleList<double> *)CONCAT17(uVar1,in_stack_ffffffffffffffa0),
               (TPZAutoPointer<TPZDohrAssembleItem<double>_> *)assembleItem);
    TPZAutoPointer<TPZDohrAssembleItem<double>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleItem<double>_> *)in_stack_ffffffffffffff80);
    PopItem(in_stack_ffffffffffffffb8);
    TPZDohrPrecondV2SubData<double,_TPZDohrSubstruct<double>_>::operator=
              ((TPZDohrPrecondV2SubData<double,_TPZDohrSubstruct<double>_> *)
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    TPZDohrPrecondV2SubData<double,_TPZDohrSubstruct<double>_>::~TPZDohrPrecondV2SubData
              ((TPZDohrPrecondV2SubData<double,_TPZDohrSubstruct<double>_> *)
               in_stack_ffffffffffffff80);
  }
  TPZDohrPrecondV2SubData<double,_TPZDohrSubstruct<double>_>::~TPZDohrPrecondV2SubData
            ((TPZDohrPrecondV2SubData<double,_TPZDohrSubstruct<double>_> *)in_stack_ffffffffffffff80
            );
  return local_8;
}

Assistant:

void *TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork(void *voidptr)
{
	TPZDohrPrecondV2SubDataList<TVar,TSubStruct>	*myptr = (TPZDohrPrecondV2SubDataList<TVar,TSubStruct> *) voidptr;
	TPZDohrPrecondV2SubData<TVar,TSubStruct> data = myptr->PopItem();
	while (data.IsValid()) {
		data.fSubStructure->Contribute_v2_local(data.fInput_local,data.fv2_local->fAssembleData);
		myptr->fAssemblyStructure->AddItem(data.fv2_local);
		data = myptr->PopItem();
	}
	return voidptr;
}